

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::makeSampledImageType(Builder *this,Id imageType)

{
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  *this_00;
  Id IVar1;
  mapped_type *pmVar2;
  mapped_type_conflict *pmVar3;
  int t;
  long lVar4;
  Instruction *type;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  this_00 = &this->groupedTypes;
  lVar4 = 0;
  do {
    local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x1b;
    pmVar2 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,(key_type *)&local_48);
    if ((int)((ulong)((long)(pmVar2->
                            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pmVar2->
                           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 3) <= lVar4) {
      type = (Instruction *)::operator_new(0x60);
      IVar1 = this->uniqueId + 1;
      this->uniqueId = IVar1;
      type->_vptr_Instruction = (_func_int **)&PTR__Instruction_0089f058;
      type->resultId = IVar1;
      type->typeId = 0;
      type->opCode = OpTypeSampledImage;
      (type->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      (type->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      (type->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (type->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (type->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      (type->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (type->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      (type->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      type->block = (Block *)0x0;
      Instruction::addIdOperand(type,imageType);
      local_48._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_48._M_impl.super__Vector_impl_data._M_start._4_4_,0x1b);
      pmVar2 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_48);
      std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back(pmVar2,&type);
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)type;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)&this->constantsTypesGlobals,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_48);
      if ((Instruction *)local_48._M_impl.super__Vector_impl_data._M_start != (Instruction *)0x0) {
        (*(*(_func_int ***)local_48._M_impl.super__Vector_impl_data._M_start)[1])();
      }
      Module::mapInstruction(&this->module,type);
      if (this->emitNonSemanticShaderDebugInfo == true) {
        local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        IVar1 = makeCompositeDebugType
                          (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
                           "type.sampled.image",NonSemanticShaderDebugInfo100Class,true);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
        local_48._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_48._M_impl.super__Vector_impl_data._M_start._4_4_,
                               type->resultId);
        pmVar3 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->debugId,(key_type *)&local_48);
        *pmVar3 = IVar1;
      }
      break;
    }
    local_48._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_48._M_impl.super__Vector_impl_data._M_start._4_4_,0x1b);
    pmVar2 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,(key_type *)&local_48);
    type = (pmVar2->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>).
           _M_impl.super__Vector_impl_data._M_start[lVar4];
    IVar1 = Instruction::getIdOperand(type,0);
    lVar4 = lVar4 + 1;
  } while (IVar1 != imageType);
  return type->resultId;
}

Assistant:

Id Builder::makeSampledImageType(Id imageType)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeSampledImage].size(); ++t) {
        type = groupedTypes[OpTypeSampledImage][t];
        if (type->getIdOperand(0) == imageType)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeSampledImage);
    type->addIdOperand(imageType);

    groupedTypes[OpTypeSampledImage].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    if (emitNonSemanticShaderDebugInfo)
    {
        auto const debugResultId = makeCompositeDebugType({}, "type.sampled.image", NonSemanticShaderDebugInfo100Class, true);
        debugId[type->getResultId()] = debugResultId;
    }

    return type->getResultId();
}